

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O2

vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *
AssemblyCode::buildControlFlowGraph
          (vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
           *__return_storage_ptr__,AssemblyCommands *commands)

{
  ulong uVar1;
  int iVar2;
  element_type *peVar3;
  pointer pCVar4;
  long lVar5;
  AbstractJumpCommand *this;
  mapped_type *pmVar6;
  long lVar7;
  pointer psVar8;
  ulong uVar9;
  pointer psVar10;
  ulong uVar11;
  CodeLine *labelJumpLine;
  CodeLine codeLine;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelToIndexMap;
  pointer local_128;
  pointer local_120;
  undefined1 local_118 [32];
  pointer ppCStack_f8;
  pointer local_f0;
  pointer ppCStack_e8;
  pointer local_e0;
  pointer ppCStack_d8;
  _Rb_tree_node_base local_c8;
  size_t local_a8;
  _Rb_tree_node_base local_98;
  size_t local_78;
  bool local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  buildLabelMap_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_60,commands);
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 0;
  uVar9 = 0;
  while( true ) {
    psVar8 = (commands->
             super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar10 = (commands->
              super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)psVar10 - (long)psVar8 >> 4) <= uVar9) break;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._M_color = _S_red;
    local_c8._M_parent = (_Base_ptr)0x0;
    local_e0 = (pointer)0x0;
    ppCStack_d8 = (pointer)0x0;
    local_f0 = (pointer)0x0;
    ppCStack_e8 = (pointer)0x0;
    local_118._24_8_ = (pointer)0x0;
    ppCStack_f8 = (pointer)0x0;
    local_c8._M_left = &local_c8;
    local_a8 = 0;
    local_98._M_color = _S_red;
    local_98._M_parent = (_Base_ptr)0x0;
    local_98._M_left = &local_98;
    local_78 = 0;
    local_118._16_4_ = (undefined4)uVar9;
    local_c8._M_right = local_c8._M_left;
    local_98._M_right = local_98._M_left;
    std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *)local_118,
               (__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(psVar8->
                       super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + lVar7));
    lVar5 = *(long *)((long)&(((commands->
                               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar7);
    if (lVar5 == 0) {
      local_70 = false;
    }
    else {
      lVar5 = __dynamic_cast(lVar5,&AssemblyCommand::typeinfo,&MoveRegRegCommand::typeinfo,0);
      local_70 = lVar5 != 0;
    }
    std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::push_back
              (__return_storage_ptr__,(CodeLine *)local_118);
    CodeLine::~CodeLine((CodeLine *)local_118);
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0x10;
  }
  for (uVar9 = 0; uVar11 = (long)psVar10 - (long)psVar8 >> 4, uVar9 < uVar11; uVar9 = uVar9 + 1) {
    peVar3 = psVar8[uVar9].
             super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 == (element_type *)0x0) ||
       (this = (AbstractJumpCommand *)
               __dynamic_cast(peVar3,&AssemblyCommand::typeinfo,&AbstractJumpCommand::typeinfo,0),
       this == (AbstractJumpCommand *)0x0)) {
      uVar1 = uVar9 + 1;
      if (uVar11 != uVar1) {
        pCVar4 = (__return_storage_ptr__->
                 super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_118._0_8_ = pCVar4 + uVar1;
        std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
        emplace_back<AssemblyCode::CodeLine*>
                  ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                   &pCVar4[uVar9].nextLines,(CodeLine **)local_118);
        pCVar4 = (__return_storage_ptr__->
                 super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_118._0_8_ = pCVar4 + uVar9;
        std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
        emplace_back<AssemblyCode::CodeLine*>
                  ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                   &pCVar4[uVar1].prevLines,(CodeLine **)local_118);
      }
    }
    else {
      AbstractJumpCommand::getLabel_abi_cxx11_((string *)local_118,this);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_60,(string *)local_118);
      iVar2 = *pmVar6;
      pCVar4 = (__return_storage_ptr__->
               super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>).
               _M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::~string((string *)local_118);
      local_128 = pCVar4 + iVar2;
      std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                (&(__return_storage_ptr__->
                  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar9].nextLines,&local_128);
      local_118._0_8_ =
           (__return_storage_ptr__->
           super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>).
           _M_impl.super__Vector_impl_data._M_start + uVar9;
      std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
      emplace_back<AssemblyCode::CodeLine*>
                ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                 &local_128->prevLines,(CodeLine **)local_118);
      lVar7 = __dynamic_cast(this,&AbstractJumpCommand::typeinfo,&JumpCommand::typeinfo,0);
      if ((lVar7 == 0) &&
         ((long)(commands->
                super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(commands->
                super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4 != uVar9 + 1)) {
        pCVar4 = (__return_storage_ptr__->
                 super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_118._0_8_ = pCVar4 + uVar9 + 1;
        std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                  (&pCVar4[uVar9].nextLines,(value_type *)local_118);
        local_120 = (__return_storage_ptr__->
                    super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar9;
        std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
        emplace_back<AssemblyCode::CodeLine*>
                  ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                   (local_118._0_8_ + 0x30),&local_120);
      }
    }
    psVar8 = (commands->
             super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar10 = (commands->
              super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AssemblyCode::CodeLine> AssemblyCode::buildControlFlowGraph(const AssemblyCommands &commands) {
    std::map<std::string, int> labelToIndexMap = buildLabelMap(commands);
    std::vector<AssemblyCode::CodeLine> lines;

    // fill lines
    for (int i = 0; i < commands.size(); ++i) {
        CodeLine codeLine;
        codeLine.lineNumber = i;
        codeLine.command = commands[i];

        AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
                dynamic_cast<AssemblyCode::MoveRegRegCommand*>(commands[i].get());

        codeLine.isMoveRegReg = moveRegRegCommand != nullptr;

        lines.push_back(codeLine);
    }

    // build graph
    for (int i = 0; i < commands.size(); ++i) {
        const AbstractJumpCommand* abstractJumpCommand = dynamic_cast<const AbstractJumpCommand*>(commands[i].get());
        if (abstractJumpCommand != nullptr) {
            CodeLine* labelJumpLine = &lines[labelToIndexMap[abstractJumpCommand->getLabel()]];

            lines[i].nextLines.push_back(labelJumpLine);
            labelJumpLine->prevLines.push_back(&lines[i]);

            const JumpCommand* jumpCommand = dynamic_cast<const JumpCommand*>(abstractJumpCommand);
            if (jumpCommand == nullptr && (i + 1) != commands.size()) {
                // conditional jump
                CodeLine* nextLine = &lines[i + 1];
                lines[i].nextLines.push_back(nextLine);
                nextLine->prevLines.push_back(&lines[i]);
            }
        } else {
            if ((i + 1) != commands.size()) {
                lines[i].nextLines.push_back(&lines[i + 1]);
                lines[i + 1].prevLines.push_back(&lines[i]);
            }
        }
    }

    return lines;
}